

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O2

double units::read1To10(string *str,size_t *index)

{
  int iVar1;
  long lVar2;
  int iVar3;
  long lVar4;
  
  lVar2 = 0;
  do {
    lVar4 = lVar2;
    if (lVar4 == 0xd8) {
      return NAN;
    }
    iVar1 = *(int *)((long)&lt10 + lVar4);
    iVar3 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)str,*index,
                    (long)iVar1,*(char **)((long)&DAT_0047b6d0 + lVar4));
    lVar2 = lVar4 + 0x18;
  } while (iVar3 != 0);
  *index = *index + (long)iVar1;
  return *(double *)((long)&DAT_0047b6c8 + lVar4);
}

Assistant:

static double read1To10(const std::string& str, size_t& index)
{
    for (const auto& num : lt10) {
        if (str.compare(index, std::get<2>(num), std::get<0>(num)) == 0) {
            index += std::get<2>(num);
            return std::get<1>(num);
        }
    }
    return constants::invalid_conversion;
}